

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
InsertUnique(KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,map_index_t b,KeyNode *node)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v;
  LogMessage *pLVar1;
  NodeBase **ppNVar2;
  uint *puVar3;
  bool bVar4;
  NodeAndBucket NVar5;
  NodeBase **head;
  LogMessage local_78;
  Voidify local_61;
  ViewType local_60;
  NodeBase *local_50;
  map_index_t local_48;
  byte local_39;
  LogMessage local_38;
  Voidify local_21;
  NodeBase *local_20;
  KeyNode *node_local;
  KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pKStack_10;
  map_index_t b_local;
  KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_39 = 0;
  bVar4 = true;
  if ((this->super_UntypedMapBase).index_of_first_non_null_ !=
      (this->super_UntypedMapBase).num_buckets_) {
    bVar4 = (this->super_UntypedMapBase).table_
            [(this->super_UntypedMapBase).index_of_first_non_null_] != (NodeBase *)0x0;
  }
  local_20 = &node->super_NodeBase;
  node_local._4_4_ = b;
  pKStack_10 = this;
  if (!bVar4) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
               ,0x310,
               "index_of_first_non_null_ == num_buckets_ || table_[index_of_first_non_null_] != nullptr"
              );
    local_39 = 1;
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar1);
  }
  if ((local_39 & 1) == 0) {
    v = KeyNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        key((KeyNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_20);
    local_60 = TransparentSupport<std::__cxx11::string>::ToView<std::__cxx11::string>(v);
    NVar5 = FindHelper(this,local_60);
    local_50 = NVar5.node;
    local_48 = NVar5.bucket;
    if (local_50 != (NodeBase *)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                 ,0x315,"FindHelper(TS::ToView(node->key())).node == nullptr");
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_78);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_61,pLVar1);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_78);
    }
    AssertLoadFactor(this);
    ppNVar2 = (this->super_UntypedMapBase).table_ + node_local._4_4_;
    if (*ppNVar2 == (NodeBase *)0x0) {
      *ppNVar2 = local_20;
      local_20->next = (NodeBase *)0x0;
      puVar3 = std::min<unsigned_int>
                         (&(this->super_UntypedMapBase).index_of_first_non_null_,
                          (uint *)((long)&node_local + 4));
      (this->super_UntypedMapBase).index_of_first_non_null_ = *puVar3;
    }
    else {
      bVar4 = UntypedMapBase::ShouldInsertAfterHead(&this->super_UntypedMapBase,local_20);
      if (bVar4) {
        local_20->next = (*ppNVar2)->next;
        (*ppNVar2)->next = local_20;
      }
      else {
        local_20->next = *ppNVar2;
        *ppNVar2 = local_20;
      }
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_38);
}

Assistant:

void InsertUnique(map_index_t b, KeyNode* node) {
    ABSL_DCHECK(index_of_first_non_null_ == num_buckets_ ||
                table_[index_of_first_non_null_] != nullptr);
    // In practice, the code that led to this point may have already
    // determined whether we are inserting into an empty list, a short list,
    // or whatever.  But it's probably cheap enough to recompute that here;
    // it's likely that we're inserting into an empty or short list.
    ABSL_DCHECK(FindHelper(TS::ToView(node->key())).node == nullptr);
    AssertLoadFactor();
    auto*& head = table_[b];
    if (head == nullptr) {
      head = node;
      node->next = nullptr;
      index_of_first_non_null_ = (std::min)(index_of_first_non_null_, b);
    } else if (ShouldInsertAfterHead(node)) {
      node->next = head->next;
      head->next = node;
    } else {
      node->next = head;
      head = node;
    }
  }